

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AVLTree.cpp
# Opt level: O2

void __thiscall
itis::AVLTree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
balance(AVLTree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        *this,vector<itis::AVLTreeNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_**,_std::allocator<itis::AVLTreeNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_**>_>
              *path)

{
  pointer pppAVar1;
  AVLTreeNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  **ppAVar2;
  int iVar3;
  AVLTreeNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *pAVar4;
  pointer pppAVar5;
  
  std::
  __reverse<__gnu_cxx::__normal_iterator<itis::AVLTreeNode<std::__cxx11::string>***,std::vector<itis::AVLTreeNode<std::__cxx11::string>**,std::allocator<itis::AVLTreeNode<std::__cxx11::string>**>>>>
            ((path->
             super__Vector_base<itis::AVLTreeNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_**,_std::allocator<itis::AVLTreeNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_**>_>
             )._M_impl.super__Vector_impl_data._M_start,
             (path->
             super__Vector_base<itis::AVLTreeNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_**,_std::allocator<itis::AVLTreeNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_**>_>
             )._M_impl.super__Vector_impl_data._M_finish);
  pppAVar5 = (path->
             super__Vector_base<itis::AVLTreeNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_**,_std::allocator<itis::AVLTreeNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_**>_>
             )._M_impl.super__Vector_impl_data._M_start;
  pppAVar1 = (path->
             super__Vector_base<itis::AVLTreeNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_**,_std::allocator<itis::AVLTreeNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_**>_>
             )._M_impl.super__Vector_impl_data._M_finish;
  do {
    if (pppAVar5 == pppAVar1) {
      return;
    }
    ppAVar2 = *pppAVar5;
    AVLTreeNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    updateValues(*ppAVar2);
    iVar3 = AVLTreeNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::balanceFactor(*ppAVar2);
    if (iVar3 < 2) {
LAB_00104b9c:
      iVar3 = AVLTreeNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::balanceFactor(*ppAVar2);
      if (1 < iVar3) {
        pAVar4 = AVLTreeNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::left_rotate((*ppAVar2)->left);
        (*ppAVar2)->left = pAVar4;
        goto LAB_00104bbc;
      }
      iVar3 = AVLTreeNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::balanceFactor(*ppAVar2);
      if (iVar3 < -1) {
        iVar3 = AVLTreeNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::balanceFactor((*ppAVar2)->right);
        if (0 < iVar3) goto LAB_00104bdf;
LAB_00104bfd:
        pAVar4 = AVLTreeNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::left_rotate(*ppAVar2);
        goto LAB_00104c05;
      }
LAB_00104bdf:
      iVar3 = AVLTreeNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::balanceFactor(*ppAVar2);
      if (iVar3 < -1) {
        pAVar4 = AVLTreeNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::right_rotate((*ppAVar2)->right);
        (*ppAVar2)->right = pAVar4;
        goto LAB_00104bfd;
      }
    }
    else {
      iVar3 = AVLTreeNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::balanceFactor((*ppAVar2)->left);
      if (iVar3 < 0) goto LAB_00104b9c;
LAB_00104bbc:
      pAVar4 = AVLTreeNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::right_rotate(*ppAVar2);
LAB_00104c05:
      *ppAVar2 = pAVar4;
    }
    pppAVar5 = pppAVar5 + 1;
  } while( true );
}

Assistant:

void AVLTree<T>::balance(std::vector<AVLTreeNode<T> **> path) {  // starting from root
    std::reverse(path.begin(), path.end());

    for (auto indirect : path) {
      (*indirect)->updateValues();

      if ((*indirect)->balanceFactor() >= 2 and (*indirect)->left->balanceFactor() >= 0) {  // left - left
        *indirect = (*indirect)->right_rotate();

      } else if ((*indirect)->balanceFactor() >= 2) {  // left - right
        (*indirect)->left = (*indirect)->left->left_rotate();
        *indirect = (*indirect)->right_rotate();
      }

      else if ((*indirect)->balanceFactor() <= -2 and (*indirect)->right->balanceFactor() <= 0) {  // right - right
        *indirect = (*indirect)->left_rotate();

      } else if ((*indirect)->balanceFactor() <= -2) {  // right - left
        (*indirect)->right = ((*indirect)->right)->right_rotate();
        *indirect = (*indirect)->left_rotate();
      }
    }
  }